

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yangdata.c
# Opt level: O1

void remove_iffeature_type(lys_type *type,ly_ctx *ctx)

{
  lys_type_bit *plVar1;
  ulong uVar2;
  long lVar3;
  
  if (type->base == LY_TYPE_ENUM) {
    if ((type->info).bits.count != 0) {
      lVar3 = 0x28;
      uVar2 = 0;
      do {
        plVar1 = (type->info).bits.bit;
        lys_iffeature_free(ctx,*(undefined8 *)((long)&plVar1->name + lVar3),
                           *(undefined1 *)((long)plVar1 + lVar3 + -0xd),0,0);
        *(undefined1 *)((long)plVar1 + lVar3 + -0xd) = 0;
        *(undefined8 *)((long)&plVar1->name + lVar3) = 0;
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x30;
      } while (uVar2 < (type->info).bits.count);
    }
  }
  else if ((type->base == LY_TYPE_BITS) && ((type->info).bits.count != 0)) {
    lVar3 = 0x28;
    uVar2 = 0;
    do {
      plVar1 = (type->info).bits.bit;
      lys_iffeature_free(ctx,*(undefined8 *)((long)&plVar1->name + lVar3),
                         *(undefined1 *)((long)plVar1 + lVar3 + -0xd),0,0);
      *(undefined1 *)((long)plVar1 + lVar3 + -0xd) = 0;
      *(undefined8 *)((long)&plVar1->name + lVar3) = 0;
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x30;
    } while (uVar2 < (type->info).bits.count);
  }
  return;
}

Assistant:

void remove_iffeature_type(struct lys_type *type, struct ly_ctx *ctx) {
    unsigned int i;

    if (type->base == LY_TYPE_ENUM) {
        for (i = 0; i < type->info.enums.count; ++i) {
            remove_iffeature(&type->info.enums.enm[i].iffeature, &type->info.enums.enm[i].iffeature_size, ctx);
        }
    } else if (type->base == LY_TYPE_BITS) {
        for (i = 0; i < type->info.bits.count; ++i) {
            remove_iffeature(&type->info.bits.bit[i].iffeature, &type->info.bits.bit[i].iffeature_size, ctx);
        }
    }
}